

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wlabel(OutputFile *this,label_t l)

{
  ostream *o;
  OutputFile *this_local;
  label_t l_local;
  
  o = stream(this);
  operator<<(o,l);
  return this;
}

Assistant:

OutputFile & OutputFile::wlabel (label_t l)
{
	stream () << l;
	return *this;
}